

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O3

IRet * __thiscall
deqp::gls::BuiltinPrecisionTests::Functions::OuterProduct<2,_2>::doApply
          (IRet *__return_storage_ptr__,OuterProduct<2,_2> *this,EvalContext *ctx,IArgs *iargs)

{
  Vector<tcu::Interval,_2> *pVVar1;
  bool bVar2;
  Mul *pMVar3;
  long lVar4;
  IArgs *pIVar5;
  undefined8 uVar6;
  bool bVar7;
  bool *pbVar8;
  undefined1 local_86;
  undefined1 local_85;
  uint local_84;
  IRet *local_80;
  Interval *local_78;
  long local_70;
  bool *local_68;
  Interval *local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  undefined8 local_48;
  double dStack_40;
  double local_38;
  
  pIVar5 = iargs;
  local_80 = __return_storage_ptr__;
  tcu::Matrix<tcu::Interval,_2,_2>::Matrix(__return_storage_ptr__);
  uVar6 = CONCAT71((int7)((ulong)pIVar5 >> 8),1);
  lVar4 = 0;
  do {
    local_84 = (uint)uVar6;
    local_78 = (local_80->m_data).m_data[0].m_data + lVar4;
    local_70 = lVar4 * 0x18;
    lVar4 = 0;
    bVar2 = true;
    do {
      bVar7 = bVar2;
      pbVar8 = &iargs->a->m_data[0].m_hasNaN + local_70;
      pVVar1 = iargs->b;
      pMVar3 = instance<deqp::gls::BuiltinPrecisionTests::Functions::Mul>();
      local_50 = &local_86;
      local_58 = &local_85;
      local_68 = pbVar8;
      local_60 = pVVar1->m_data + lVar4;
      (**(code **)((long)*pMVar3 + 0x40))(&local_48,pMVar3,ctx,&local_68);
      local_78[lVar4 * 2].m_hi = local_38;
      *(undefined8 *)(local_78 + lVar4 * 2) = local_48;
      local_78[lVar4 * 2].m_lo = dStack_40;
      lVar4 = 1;
      bVar2 = false;
    } while (bVar7);
    uVar6 = 0;
  } while ((local_84 & 1) != 0);
  return local_80;
}

Assistant:

IRet	doApply	(const EvalContext& ctx, const IArgs& iargs) const
	{
		IRet	ret;

		for (int row = 0; row < Rows; ++row)
		{
			for (int col = 0; col < Cols; ++col)
				ret[col][row] = call<Mul>(ctx, iargs.a[row], iargs.b[col]);
		}

		return ret;
	}